

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O1

int luaB_tonumber(lua_State *L)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char *__s;
  lua_Integer lVar5;
  size_t sVar6;
  byte *__s_00;
  lua_Number lVar7;
  int isnum;
  size_t l;
  int local_3c;
  size_t local_38;
  
  iVar3 = lua_type(L,2);
  if (iVar3 < 1) {
    lVar7 = lua_tonumberx(L,1,&local_3c);
    if (local_3c != 0) {
      lua_pushnumber(L,lVar7);
      return 1;
    }
    luaL_checkany(L,1);
  }
  else {
    __s = luaL_checklstring(L,1,&local_38);
    lVar5 = luaL_checkinteger(L,2);
    iVar3 = (int)lVar5;
    if (0x22 < iVar3 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar6 = strspn(__s," \f\n\r\t\v");
    cVar1 = __s[sVar6];
    __s_00 = (byte *)(__s + ((cVar1 - 0x2bU & 0xfd) == 0) + sVar6);
    iVar4 = isalnum((uint)*__s_00);
    if (iVar4 != 0) {
      lVar7 = 0.0;
      do {
        bVar2 = *__s_00;
        if (bVar2 - 0x30 < 10) {
          iVar4 = (char)bVar2 + -0x30;
        }
        else {
          iVar4 = toupper((uint)bVar2);
          iVar4 = iVar4 + -0x37;
        }
        __s_00 = __s_00 + (iVar4 < iVar3);
        if (iVar3 <= iVar4) break;
        lVar7 = lVar7 * (double)iVar3 + (double)iVar4;
        iVar4 = isalnum((uint)*__s_00);
      } while (iVar4 != 0);
      sVar6 = strspn((char *)__s_00," \f\n\r\t\v");
      if (__s_00 + sVar6 == (byte *)(__s + local_38)) {
        if (cVar1 == '-') {
          lVar7 = -lVar7;
        }
        lua_pushnumber(L,lVar7);
        return 1;
      }
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion */
    int isnum;
    lua_Number n = lua_tonumberx(L, 1, &isnum);
    if (isnum) {
      lua_pushnumber(L, n);
      return 1;
    }  /* else not a number; must be something */
    luaL_checkany(L, 1);
  }
  else {
    size_t l;
    const char *s = luaL_checklstring(L, 1, &l);
    const char *e = s + l;  /* end point for 's' */
    int base = luaL_checkint(L, 2);
    int neg = 0;
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    s += strspn(s, SPACECHARS);  /* skip initial spaces */
    if (*s == '-') { s++; neg = 1; }  /* handle signal */
    else if (*s == '+') s++;
    if (isalnum((unsigned char)*s)) {
      lua_Number n = 0;
      do {
        int digit = (isdigit((unsigned char)*s)) ? *s - '0'
                       : toupper((unsigned char)*s) - 'A' + 10;
        if (digit >= base) break;  /* invalid numeral; force a fail */
        n = n * (lua_Number)base + (lua_Number)digit;
        s++;
      } while (isalnum((unsigned char)*s));
      s += strspn(s, SPACECHARS);  /* skip trailing spaces */
      if (s == e) {  /* no invalid trailing characters? */
        lua_pushnumber(L, (neg) ? -n : n);
        return 1;
      }  /* else not a number */
    }  /* else not a number */
  }
  lua_pushnil(L);  /* not a number */
  return 1;
}